

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerCPP::emit_resources(CompilerCPP *this)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *puVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t id_00;
  SPIRConstant *constant;
  SPIRConstantOp *constant_00;
  SPIRType *pSVar4;
  mapped_type *pmVar5;
  SPIRVariable *pSVar6;
  SPIREntryPoint *pSVar7;
  long lVar8;
  ID *pIVar9;
  uint *puVar10;
  Variant *id;
  Variant *pVVar11;
  uint *puVar12;
  Variant *id_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  string local_50;
  
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          buffer_size;
  if (sVar2 != 0) {
    pVVar11 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
              super_VectorView<spirv_cross::Variant>.ptr;
    lVar8 = sVar2 * 0x18;
    do {
      if (pVVar11->type == TypeConstantOp) {
        constant_00 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar11);
        CompilerGLSL::emit_specialization_constant_op(&this->super_CompilerGLSL,constant_00);
      }
      else if (pVVar11->type == TypeConstant) {
        constant = Variant::get<spirv_cross::SPIRConstant>(pVVar11);
        if ((constant->specialization != false) || ((constant->is_used_as_lut & 1U) != 0)) {
          if ((constant->specialization != false) &&
             ((this->super_CompilerGLSL).options.vulkan_semantics == false)) {
            id_00 = Compiler::get_decoration
                              ((Compiler *)this,(ID)(constant->super_IVariant).self.id,
                               DecorationSpecId);
            CompilerGLSL::constant_value_macro_name_abi_cxx11_
                      (&local_50,&this->super_CompilerGLSL,id_00);
            ::std::__cxx11::string::operator=
                      ((string *)&constant->specialization_constant_macro_name,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          CompilerGLSL::emit_constant(&this->super_CompilerGLSL,constant);
        }
      }
      pVVar11 = pVVar11 + 1;
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != 0);
    sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
            buffer_size;
    if (sVar2 != 0) {
      pVVar11 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.ptr;
      puVar1 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      lVar8 = sVar2 * 0x18;
      do {
        if ((((pVVar11->type == TypeType) &&
             (pSVar4 = Variant::get<spirv_cross::SPIRType>(pVVar11), pSVar4->basetype == Struct)) &&
            ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size == 0)) &&
           (pSVar4->pointer == false)) {
          pIVar9 = &(pSVar4->super_IVariant).self;
          pmVar5 = ::std::__detail::
                   _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)puVar1,pIVar9);
          if ((((pmVar5->decoration).decoration_flags.lower & 4) == 0) &&
             (pmVar5 = ::std::__detail::
                       _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)puVar1,pIVar9),
             ((pmVar5->decoration).decoration_flags.lower & 8) == 0)) {
            CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar4);
          }
        }
        pVVar11 = pVVar11 + 1;
        lVar8 = lVar8 + -0x18;
      } while (lVar8 != 0);
    }
  }
  CompilerGLSL::statement<char_const(&)[20],std::__cxx11::string&>
            (&this->super_CompilerGLSL,(char (*) [20])"struct Resources : ",&this->resource_type);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          buffer_size;
  if (sVar2 != 0) {
    pVVar11 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
              super_VectorView<spirv_cross::Variant>.ptr;
    puVar1 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
    lVar8 = sVar2 * 0x18;
    do {
      if (pVVar11->type == TypeVariable) {
        pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar11);
        pSVar4 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(pSVar6->super_IVariant).field_0xc);
        if (((pSVar6->storage != Function) && (pSVar4->pointer == true)) &&
           ((pSVar4->storage == StorageClassUniform &&
            (bVar3 = Compiler::is_hidden_variable((Compiler *)this,pSVar6,false), !bVar3)))) {
          pIVar9 = &(pSVar4->super_IVariant).self;
          pmVar5 = ::std::__detail::
                   _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)puVar1,pIVar9);
          if ((((pmVar5->decoration).decoration_flags.lower & 4) != 0) ||
             (pmVar5 = ::std::__detail::
                       _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)puVar1,pIVar9),
             ((pmVar5->decoration).decoration_flags.lower & 8) != 0)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x20])(this,pSVar6);
          }
        }
      }
      pVVar11 = pVVar11 + 1;
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != 0);
    sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
            buffer_size;
    if (sVar2 != 0) {
      pVVar11 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.ptr;
      lVar8 = sVar2 * 0x18;
      do {
        if (pVVar11->type == TypeVariable) {
          pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar11);
          pSVar4 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              *(uint *)&(pSVar6->super_IVariant).field_0xc);
          bVar3 = Compiler::is_hidden_variable((Compiler *)this,pSVar6,false);
          if ((((!bVar3) && (pSVar6->storage != Function)) && (pSVar4->pointer == true)) &&
             (pSVar4->storage == PushConstant)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x21])(this,pSVar6);
          }
        }
        pVVar11 = pVVar11 + 1;
        lVar8 = lVar8 + -0x18;
      } while (lVar8 != 0);
      sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
              super_VectorView<spirv_cross::Variant>.buffer_size;
      if (sVar2 != 0) {
        pVVar11 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.ptr;
        lVar8 = sVar2 * 0x18;
        do {
          if (pVVar11->type == TypeVariable) {
            pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar11);
            pSVar4 = Variant::get<spirv_cross::SPIRType>
                               ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr +
                                *(uint *)&(pSVar6->super_IVariant).field_0xc);
            if (((pSVar6->storage != Function) &&
                (bVar3 = Compiler::is_hidden_variable((Compiler *)this,pSVar6,false), !bVar3)) &&
               ((pSVar4->pointer == true &&
                (((pSVar6->storage | StorageClassUniform) == Output &&
                 (bVar3 = Compiler::interface_variable_exists_in_entry_point
                                    ((Compiler *)this,(pSVar6->super_IVariant).self.id), bVar3))))))
            {
              emit_interface_block(this,pSVar6);
            }
          }
          pVVar11 = pVVar11 + 1;
          lVar8 = lVar8 + -0x18;
        } while (lVar8 != 0);
        sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.buffer_size;
        if (sVar2 != 0) {
          pVVar11 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr;
          lVar8 = sVar2 * 0x18;
          do {
            if (pVVar11->type == TypeVariable) {
              pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar11);
              pSVar4 = Variant::get<spirv_cross::SPIRType>
                                 ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                  super_VectorView<spirv_cross::Variant>.ptr +
                                  *(uint *)&(pSVar6->super_IVariant).field_0xc);
              if ((((pSVar6->storage != Function) &&
                   (bVar3 = Compiler::is_hidden_variable((Compiler *)this,pSVar6,false), !bVar3)) &&
                  (pSVar4->pointer == true)) &&
                 ((pSVar4->storage == AtomicCounter ||
                  (pSVar4->storage == StorageClassUniformConstant)))) {
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x22])(this,pSVar6);
              }
            }
            pVVar11 = pVVar11 + 1;
            lVar8 = lVar8 + -0x18;
          } while (lVar8 != 0);
        }
      }
    }
  }
  sVar2 = (this->super_CompilerGLSL).super_Compiler.global_variables.super_VectorView<unsigned_int>.
          buffer_size;
  if (sVar2 != 0) {
    puVar12 = (this->super_CompilerGLSL).super_Compiler.global_variables.
              super_VectorView<unsigned_int>.ptr;
    puVar10 = puVar12 + sVar2;
    bVar3 = false;
    do {
      while (pSVar6 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + *puVar12),
            pSVar6->storage == StorageClassWorkgroup) {
        emit_shared(this,pSVar6);
        puVar12 = puVar12 + 1;
        bVar3 = true;
        if (puVar12 == puVar10) goto LAB_00305e03;
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar10);
    if (bVar3) {
LAB_00305e03:
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x3dee59);
    }
  }
  CompilerGLSL::statement<char_const(&)[40]>
            (&this->super_CompilerGLSL,(char (*) [40])"inline void init(spirv_cross_shader& s)");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[11]>
            (&this->super_CompilerGLSL,&this->resource_type,(char (*) [11])"::init(s);");
  sVar2 = (this->resource_registrations).
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size;
  if (sVar2 != 0) {
    ts = (this->resource_registrations).
         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .ptr;
    lVar8 = sVar2 << 5;
    do {
      CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,ts);
      ts = ts + 1;
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != 0);
  }
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::clear(&this->resource_registrations);
  CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x3dee59);
  CompilerGLSL::statement<char_const(&)[18]>
            (&this->super_CompilerGLSL,(char (*) [18])"Resources* __res;");
  pSVar7 = Compiler::get_entry_point((Compiler *)this);
  if (pSVar7->model == ExecutionModelGLCompute) {
    CompilerGLSL::statement<char_const(&)[36]>
              (&this->super_CompilerGLSL,(char (*) [36])"ComputePrivateResources __priv_res;");
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x3dee59);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.global_variables.super_VectorView<unsigned_int>.
          buffer_size;
  if (sVar2 != 0) {
    puVar10 = (this->super_CompilerGLSL).super_Compiler.global_variables.
              super_VectorView<unsigned_int>.ptr;
    puVar12 = puVar10 + sVar2;
    bVar3 = false;
    do {
      while (pSVar6 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + *puVar10),
            pSVar6->storage == Private) {
        CompilerGLSL::variable_decl_abi_cxx11_(&local_50,&this->super_CompilerGLSL,pSVar6);
        CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&local_50,(char (*) [2])0x405f81);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        puVar10 = puVar10 + 1;
        bVar3 = true;
        if (puVar10 == puVar12) goto LAB_00305f6f;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar12);
    if (!bVar3) {
      return;
    }
LAB_00305f6f:
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x3dee59);
  }
  return;
}

Assistant:

void CompilerCPP::emit_resources()
{
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			bool needs_declaration = c.specialization || c.is_used_as_lut;

			if (needs_declaration)
			{
				if (!options.vulkan_semantics && c.specialization)
				{
					c.specialization_constant_macro_name =
					    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
				}
				emit_constant(c);
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			emit_specialization_constant_op(id.get<SPIRConstantOp>());
		}
	}

	// Output all basic struct types which are not Block or BufferBlock as these are declared inplace
	// when such variables are instantiated.
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeType)
		{
			auto &type = id.get<SPIRType>();
			if (type.basetype == SPIRType::Struct && type.array.empty() && !type.pointer &&
			    (!ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) &&
			     !ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock)))
			{
				emit_struct(type);
			}
		}
	}

	statement("struct Resources : ", resource_type);
	begin_scope();

	// Output UBOs and SSBOs
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);

			if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassUniform &&
			    !is_hidden_variable(var) &&
			    (ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
			     ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock)))
			{
				emit_buffer_block(var);
			}
		}
	}

	// Output push constant blocks
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);
			if (!is_hidden_variable(var) && var.storage != StorageClassFunction && type.pointer &&
			    type.storage == StorageClassPushConstant)
			{
				emit_push_constant_block(var);
			}
		}
	}

	// Output in/out interfaces.
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);

			if (var.storage != StorageClassFunction && !is_hidden_variable(var) && type.pointer &&
			    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
			    interface_variable_exists_in_entry_point(var.self))
			{
				emit_interface_block(var);
			}
		}
	}

	// Output Uniform Constants (values, samplers, images, etc).
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);

			if (var.storage != StorageClassFunction && !is_hidden_variable(var) && type.pointer &&
			    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter))
			{
				emit_uniform(var);
			}
		}
	}

	// Global variables.
	bool emitted = false;
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (var.storage == StorageClassWorkgroup)
		{
			emit_shared(var);
			emitted = true;
		}
	}

	if (emitted)
		statement("");

	statement("inline void init(spirv_cross_shader& s)");
	begin_scope();
	statement(resource_type, "::init(s);");
	for (auto &reg : resource_registrations)
		statement(reg);
	end_scope();
	resource_registrations.clear();

	end_scope_decl();

	statement("");
	statement("Resources* __res;");
	if (get_entry_point().model == ExecutionModelGLCompute)
		statement("ComputePrivateResources __priv_res;");
	statement("");

	// Emit regular globals which are allocated per invocation.
	emitted = false;
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (var.storage == StorageClassPrivate)
		{
			if (var.storage == StorageClassWorkgroup)
				emit_shared(var);
			else
				statement(CompilerGLSL::variable_decl(var), ";");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}